

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_codes_reader.c
# Opt level: O0

uint16_t read_primitive_quniform_(aom_reader *r,uint16_t n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ushort in_SI;
  int v;
  int m;
  int l;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 local_2;
  
  if (in_SI < 2) {
    local_2 = 0;
  }
  else {
    iVar1 = get_msb((uint)in_SI);
    iVar1 = (1 << ((char)iVar1 + 1U & 0x1f)) - (uint)in_SI;
    iVar2 = aom_read_literal_((aom_reader *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                              in_stack_ffffffffffffffdc);
    if (iVar1 <= iVar2) {
      iVar3 = aom_read_bit_((aom_reader *)CONCAT44(iVar1,iVar2));
      iVar2 = (iVar2 * 2 - iVar1) + iVar3;
    }
    local_2 = (uint16_t)iVar2;
  }
  return local_2;
}

Assistant:

static uint16_t read_primitive_quniform_(aom_reader *r,
                                         uint16_t n ACCT_STR_PARAM) {
  if (n <= 1) return 0;
  const int l = get_msb(n) + 1;
  const int m = (1 << l) - n;
  const int v = aom_read_literal(r, l - 1, ACCT_STR_NAME);
  return v < m ? v : (v << 1) - m + aom_read_bit(r, ACCT_STR_NAME);
}